

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double fisher_pdf(double *x,double kappa,double *mu)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_40;
  double b [1];
  
  if (0.0 <= kappa) {
    if ((kappa != 0.0) || (NAN(kappa))) {
      ribesl(kappa,0.5,1,1,&local_40);
      if (kappa < 0.0) {
        dVar4 = sqrt(kappa);
      }
      else {
        dVar4 = SQRT(kappa);
      }
      dVar4 = dVar4 / (local_40 * 15.749609945722419);
      b[0] = r8vec_length(3,mu);
      if ((b[0] != 0.0) || (NAN(b[0]))) {
        dVar2 = r8vec_length(3,x);
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          dVar3 = r8vec_dot(3,x,mu);
          dVar2 = exp((dVar3 * kappa) / (b[0] * dVar2));
          dVar4 = dVar4 * dVar2;
        }
      }
    }
    else {
      dVar4 = 0.07957747154594767;
    }
    return dVar4;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"FISHER_PDF - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  KAPPA must be nonnegative.\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"  Input KAPPA = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,kappa);
  std::operator<<(poVar1,"\n");
  exit(1);
}

Assistant:

double fisher_pdf ( double x[3], double kappa, double mu[3] )

//****************************************************************************80
//
//  Purpose:
//
//    FISHER_PDF evaluates the Fisher PDF.
//
//  Discussion:
//
//    The formula for the PDF is:
//
//      PDF(KAPPA,MU;X) = C(KAPPA) * exp ( KAPPA * MU' * X )
//
//    where:
//
//      0 <= KAPPA is the concentration parameter,
//      MU is a point on the unit sphere, the mean direction,
//      X is any point on the unit sphere,
//      and C(KAPPA) is a normalization factor:
//
//      C(KAPPA) = sqrt ( KAPPA ) / ( ( 2 * pi )^(3/2) * I(0.5,KAPPA) )
//
//    where
//
//      I(nu,X) is the Bessel function of order NU and argument X.
//
//    For a fixed value of MU, the value of KAPPA determines the
//    tendency of sample points to tend to be near MU.  In particular,
//    KAPPA = 0 corresponds to a uniform distribution of points on the
//    sphere, but as KAPPA increases, the sample points will tend to
//    cluster more closely to MU.
//
//    The Fisher distribution for points on the unit sphere is
//    analogous to the normal distribution of points on a line,
//    and, more precisely, to the von Mises distribution on a circle.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Kanti Mardia, Peter Jupp,
//    Directional Statistics,
//    Wiley, 2000,
//    LC: QA276.M335
//
//  Parameters:
//
//    Input, double X[3], the argument of the PDF.
//    X should have unit Euclidean norm, but this routine will
//    automatically work with a normalized version of X.
//
//    Input, double KAPPA, the concentration parameter.
//    0 <= KAPPA is required.
//
//    Input, double MU[3], the mean direction.
//    MU should have unit Euclidean norm, but this routine will
//    automatically work with a normalized version of MU.
//
//    Output, double FISHER_PDF, the value of the PDF.
//
{
# define NB 1

  double alpha;
  double arg;
  double b[NB];
  double cf;
  int ize;
  double mu_norm;
  double pdf;
  const double r8_pi = 3.141592653589793;
  double x_norm;

  if ( kappa < 0.0 )
  {
    cerr << "\n";
    cerr << "FISHER_PDF - Fatal error!\n";
    cerr << "  KAPPA must be nonnegative.\n";
    cerr << "  Input KAPPA = " << kappa << "\n";
    exit ( 1 );
  }

  if ( kappa == 0.0 )
  {
    pdf = 1.0 / ( 4.0 * r8_pi );
    return pdf;
  }

  alpha = 0.5;
  ize = 1;

  ribesl ( kappa, alpha, NB, ize, b );

  cf = sqrt ( kappa ) / ( sqrt ( pow ( 2.0 * r8_pi, 3 ) ) * b[0] );

  mu_norm = r8vec_length ( 3, mu );

  if ( mu_norm == 0.0 )
  {
    pdf = cf;
    return pdf;
  }

  x_norm = r8vec_length ( 3, x );

  if ( x_norm == 0.0 )
  {
    pdf = cf;
    return pdf;
  }

  arg = kappa * r8vec_dot ( 3, x, mu ) / ( x_norm * mu_norm );

  pdf = cf * exp ( arg );

  return pdf;
# undef NB
}